

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O0

ParserString
GeneratedSaxParser::Utils::toStringListItem(ParserChar **buffer,ParserChar *bufferEnd,bool *failed)

{
  UnionString UVar1;
  bool bVar2;
  bool bVar3;
  undefined1 *in_RDX;
  ParserChar *in_RSI;
  undefined8 *in_RDI;
  bool characterFound;
  ParserChar *s;
  ParserString value;
  ParserChar *local_30;
  ParserString local_10;
  
  ParserString::ParserString(&local_10);
  local_30 = (ParserChar *)*in_RDI;
  if (local_30 == (ParserChar *)0x0) {
    *in_RDX = 1;
  }
  else if (local_30 == in_RSI) {
    *in_RDX = 1;
    *in_RDI = in_RSI;
  }
  else {
    do {
      bVar2 = isWhiteSpace(*local_30);
      if (!bVar2) {
        bVar2 = false;
        goto LAB_00c5b845;
      }
      local_30 = local_30 + 1;
    } while (local_30 != in_RSI);
    *in_RDX = 1;
    *in_RDI = in_RSI;
  }
LAB_00c5b92f:
  UVar1.length = local_10.super_UnionString.length;
  UVar1.str = local_10.super_UnionString.str;
  return (ParserString)UVar1;
LAB_00c5b845:
  if (local_30 == in_RSI) goto code_r0x00c5b851;
  bVar3 = isWhiteSpace(*local_30);
  if (bVar3) {
    if (bVar2) {
      *in_RDI = local_30;
      *in_RDX = 0;
    }
    else {
      *in_RDX = 1;
      *in_RDI = local_30;
      local_10.super_UnionString.str = (ParserChar *)0x0;
      local_10.super_UnionString.length = 0;
    }
    goto LAB_00c5b92f;
  }
  if (!bVar2) {
    local_10.super_UnionString.str = local_30;
    bVar2 = true;
  }
  local_10.super_UnionString.length = local_10.super_UnionString.length + 1;
  local_30 = local_30 + 1;
  goto LAB_00c5b845;
code_r0x00c5b851:
  if (bVar2) {
    *in_RDX = 0;
    *in_RDI = local_30;
  }
  else {
    *in_RDX = 1;
    *in_RDI = local_30;
    local_10.super_UnionString.str = (ParserChar *)0x0;
    local_10.super_UnionString.length = 0;
  }
  goto LAB_00c5b92f;
}

Assistant:

ParserString Utils::toStringListItem(const ParserChar** buffer, const ParserChar* bufferEnd, bool& failed)
    {
        ParserString value;

        const ParserChar* s = *buffer;
        if ( !s )
        {
            failed = true;
            return value;
        }

        if ( s == bufferEnd )
        {
            failed = true;
            *buffer = bufferEnd;
            return value;
        }

        // Skip leading white spaces
        while ( isWhiteSpace(*s) )
        {
            ++s;
            if ( s == bufferEnd )
            {
                failed = true;
                *buffer = bufferEnd;
                return value;
            }
        }

        bool characterFound = false;
        while (true)
        {
            if ( s == bufferEnd )
            {
                if (characterFound)
                {
                    failed = false;
                    *buffer = s;
                    return value;
                }
                else
                {
                    failed = true;
                    *buffer = s;
                    value.str = 0;
                    value.length = 0;
                    return value;
                }
            }

            if ( !isWhiteSpace(*s) )
            {
                if (!characterFound)
                {
                    value.str = s;
                    characterFound = true;
                }
                value.length++;
            }
            else
                break;
            ++s;
        }
        if ( characterFound )
        {
            *buffer = s;
            failed = false;
            return value;
        }
        else
        {
            failed = true;
            *buffer = s;
            value.str = 0;
            value.length = 0;
            return value;
        }
    }